

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltimerquery.cpp
# Opt level: O0

void __thiscall QOpenGLTimeMonitor::QOpenGLTimeMonitor(QOpenGLTimeMonitor *this,QObject *parent)

{
  QObjectPrivate *pQVar1;
  QOpenGLTimeMonitorPrivate *in_RSI;
  QObject *in_RDI;
  
  pQVar1 = (QObjectPrivate *)operator_new(0xd0);
  QOpenGLTimeMonitorPrivate::QOpenGLTimeMonitorPrivate(in_RSI);
  QObject::QObject(in_RDI,pQVar1,(QObject *)in_RSI);
  *(undefined ***)in_RDI = &PTR_metaObject_00214ec0;
  return;
}

Assistant:

QOpenGLTimeMonitor::QOpenGLTimeMonitor(QObject *parent)
    : QObject(*new QOpenGLTimeMonitorPrivate, parent)
{
}